

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_expr_kint(CPState *cp,CPValue *k)

{
  CType *ct;
  CPValue *k_local;
  CPState *cp_local;
  CType *ct_1;
  
  cp_expr_sub(cp,k,0);
  for (cp_local = (CPState *)(cp->cts->tab + k->id); (uint)cp_local->c >> 0x1c == 8;
      cp_local = (CPState *)(cp->cts->tab + (cp_local->c & 0xffff))) {
  }
  if ((cp_local->c & 0xfc000000U) != 0) {
    cp_err(cp,LJ_ERR_BADVAL);
  }
  return;
}

Assistant:

static void cp_expr_kint(CPState *cp, CPValue *k)
{
  CType *ct;
  cp_expr_sub(cp, k, 0);
  ct = ctype_raw(cp->cts, k->id);
  if (!ctype_isinteger(ct->info)) cp_err(cp, LJ_ERR_BADVAL);
}